

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

bool __thiscall CGlyphMap::SetFaceByName(CGlyphMap *this,FT_Face_conflict *pFace,char *pFamilyName)

{
  int iVar1;
  long lVar2;
  FT_Face_conflict pFVar3;
  long in_FS_OFFSET;
  char aFamilyStyleName [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pFamilyName == (char *)0x0) || (this->m_NumFtFaces < 1)) {
    pFVar3 = (FT_Face_conflict)0x0;
  }
  else {
    lVar2 = 0;
    pFVar3 = (FT_Face_conflict)0x0;
    do {
      str_format(local_b8,0x80,"%s %s",this->m_aFtFaces[lVar2]->family_name,
                 this->m_aFtFaces[lVar2]->style_name);
      iVar1 = str_comp(pFamilyName,local_b8);
      if (iVar1 == 0) {
        pFVar3 = this->m_aFtFaces[lVar2];
        break;
      }
      if (pFVar3 == (FT_Face_conflict)0x0) {
        iVar1 = str_comp(pFamilyName,this->m_aFtFaces[lVar2]->family_name);
        if (iVar1 == 0) {
          pFVar3 = this->m_aFtFaces[lVar2];
        }
        else {
          pFVar3 = (FT_Face_conflict)0x0;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->m_NumFtFaces);
  }
  if (pFVar3 != (FT_Face_conflict)0x0) {
    *pFace = pFVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pFVar3 != (FT_Face_conflict)0x0;
}

Assistant:

bool CGlyphMap::SetFaceByName(FT_Face *pFace, const char *pFamilyName)
{
	FT_Face Face = NULL;
	char aFamilyStyleName[FONT_NAME_SIZE];

	if(pFamilyName != NULL)
	{
		for(int i = 0; i < m_NumFtFaces; ++i)
		{
			str_format(aFamilyStyleName, FONT_NAME_SIZE, "%s %s", m_aFtFaces[i]->family_name, m_aFtFaces[i]->style_name);
			if(str_comp(pFamilyName, aFamilyStyleName) == 0)
			{
				Face = m_aFtFaces[i];
				break;
			}

			if(!Face && str_comp(pFamilyName, m_aFtFaces[i]->family_name) == 0)
			{
				Face = m_aFtFaces[i];
			}
		}
	}

	if(Face)
	{
		*pFace = Face;
		return true;
	}
	return false;
}